

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

void ScanDirectoryFilesRecursively(char *basePath,FilePathList *files,char *filter)

{
  _Bool _Var1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  char *__s1;
  stat sStack_10c8;
  char local_1038 [4104];
  
  memset(local_1038,0,0x1000);
  __dirp = opendir(basePath);
  if (__dirp == (DIR *)0x0) {
    TraceLog(4,"FILEIO: Directory cannot be opened (%s)",basePath);
    return;
  }
  pdVar3 = readdir(__dirp);
  if (pdVar3 != (dirent *)0x0) {
    do {
      if (files->capacity <= files->count) break;
      __s1 = pdVar3->d_name;
      iVar2 = strcmp(__s1,".");
      if ((iVar2 != 0) && (iVar2 = strcmp(__s1,".."), iVar2 != 0)) {
        sprintf(local_1038,"%s/%s",basePath,__s1);
        memset(&sStack_10c8,0,0x90);
        stat(local_1038,&sStack_10c8);
        if ((sStack_10c8.st_mode & 0xf000) == 0x8000) {
          if ((filter == (char *)0x0) || (_Var1 = IsFileExtension(local_1038,filter), _Var1)) {
            strcpy(files->paths[files->count],local_1038);
            files->count = files->count + 1;
          }
          if (files->capacity <= files->count) {
LAB_00176037:
            TraceLog(4,"FILEIO: Maximum filepath scan capacity reached (%i files)");
            break;
          }
        }
        else {
          if ((filter != (char *)0x0) && (iVar2 = TextFindIndex(filter,"DIR"), -1 < iVar2)) {
            strcpy(files->paths[files->count],local_1038);
            files->count = files->count + 1;
          }
          if (files->capacity <= files->count) goto LAB_00176037;
          ScanDirectoryFilesRecursively(local_1038,files,filter);
        }
      }
      pdVar3 = readdir(__dirp);
    } while (pdVar3 != (dirent *)0x0);
  }
  closedir(__dirp);
  return;
}

Assistant:

static void ScanDirectoryFilesRecursively(const char *basePath, FilePathList *files, const char *filter)
{
    char path[MAX_FILEPATH_LENGTH] = { 0 };
    memset(path, 0, MAX_FILEPATH_LENGTH);

    struct dirent *dp = NULL;
    DIR *dir = opendir(basePath);

    if (dir != NULL)
    {
        while (((dp = readdir(dir)) != NULL) && (files->count < files->capacity))
        {
            if ((strcmp(dp->d_name, ".") != 0) && (strcmp(dp->d_name, "..") != 0))
            {
                // Construct new path from our base path
            #if defined(_WIN32)
                sprintf(path, "%s\\%s", basePath, dp->d_name);
            #else
                sprintf(path, "%s/%s", basePath, dp->d_name);
            #endif

                if (IsPathFile(path))
                {
                    if (filter != NULL)
                    {
                        if (IsFileExtension(path, filter))
                        {
                            strcpy(files->paths[files->count], path);
                            files->count++;
                        }
                    }
                    else
                    {
                        strcpy(files->paths[files->count], path);
                        files->count++;
                    }

                    if (files->count >= files->capacity)
                    {
                        TRACELOG(LOG_WARNING, "FILEIO: Maximum filepath scan capacity reached (%i files)", files->capacity);
                        break;
                    }
                }
                else
                {
                    if ((filter != NULL) && (TextFindIndex(filter, DIRECTORY_FILTER_TAG) >= 0))
                    {
                        strcpy(files->paths[files->count], path);
                        files->count++;
                    }

                    if (files->count >= files->capacity)
                    {
                        TRACELOG(LOG_WARNING, "FILEIO: Maximum filepath scan capacity reached (%i files)", files->capacity);
                        break;
                    }

                    ScanDirectoryFilesRecursively(path, files, filter);
                }
            }
        }

        closedir(dir);
    }
    else TRACELOG(LOG_WARNING, "FILEIO: Directory cannot be opened (%s)", basePath);
}